

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# max_prediction_degree_traverser.h
# Opt level: O3

bool __thiscall
draco::
MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
::TraverseFromCorner
          (MaxPredictionDegreeTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
           *this,CornerIndex corner_id)

{
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  *this_00;
  ulong *puVar1;
  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
  *pvVar2;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar3;
  iterator iVar4;
  CornerTable *pCVar5;
  pointer pIVar6;
  ulong uVar7;
  pointer piVar8;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> IVar9;
  _Bit_type *p_Var10;
  ulong uVar11;
  pointer *ppIVar12;
  long lVar13;
  MeshAttributeIndicesEncodingData *pMVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  bool bVar20;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_48;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_44;
  pointer *local_40;
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  *local_38;
  
  if ((this->prediction_degree_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->prediction_degree_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    return true;
  }
  this_00 = this->traversal_stacks_;
  iVar4._M_current =
       this->traversal_stacks_[0].
       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_44.value_ = corner_id.value_;
  if (iVar4._M_current ==
      this->traversal_stacks_[0].
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
    ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
              ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                *)this_00,iVar4,&local_44);
  }
  else {
    (iVar4._M_current)->value_ = corner_id.value_;
    this->traversal_stacks_[0].
    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  this->best_priority_ = 0;
  if (local_44.value_ == 0xffffffff) {
    uVar11 = 0xffffffff;
LAB_0012ac36:
    uVar16 = 0xffffffff;
  }
  else {
    pCVar5 = (this->
             super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
             ).corner_table_;
    uVar17 = local_44.value_ - 2;
    if (0x55555555 < (local_44.value_ + 1) * -0x55555555) {
      uVar17 = local_44.value_ + 1;
    }
    if (uVar17 == 0xffffffff) {
      uVar11 = 0xffffffff;
    }
    else {
      uVar11 = (ulong)(pCVar5->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar17].value_;
    }
    if (local_44.value_ * -0x55555555 < 0x55555556) {
      uVar17 = local_44.value_ + 2;
      if (uVar17 == 0xffffffff) goto LAB_0012ac36;
    }
    else {
      uVar17 = local_44.value_ - 1;
    }
    uVar16 = (ulong)(pCVar5->corner_to_vertex_map_).vector_.
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar17].value_;
  }
  p_Var10 = (this->
            super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
            ).is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  local_38 = this_00;
  if ((p_Var10[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0) {
    p_Var10[uVar11 >> 6] = p_Var10[uVar11 >> 6] | 1L << ((byte)uVar11 & 0x3f);
    if (local_44.value_ == 0xffffffff) {
      uVar17 = 0xffffffff;
    }
    else {
      uVar17 = local_44.value_ - 2;
      if (0x55555555 < (local_44.value_ + 1) * -0x55555555) {
        uVar17 = local_44.value_ + 1;
      }
    }
    local_48.value_ = uVar17;
    PointsSequencer::AddPointId
              ((this->
               super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
               ).traversal_observer_.sequencer_,
               (PointIndex)
               (((this->
                 super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                 ).traversal_observer_.mesh_)->faces_).vector_.
               super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(ulong)uVar17 / 3]._M_elems[uVar17 % 3].
               value_);
    pMVar14 = (this->
              super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
              ).traversal_observer_.encoding_data_;
    iVar4._M_current =
         (pMVar14->encoded_attribute_value_index_to_corner_map).
         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (pMVar14->encoded_attribute_value_index_to_corner_map).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
      ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                  *)pMVar14,iVar4,&local_48);
      pMVar14 = (this->
                super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                ).traversal_observer_.encoding_data_;
    }
    else {
      (iVar4._M_current)->value_ = uVar17;
      (pMVar14->encoded_attribute_value_index_to_corner_map).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    iVar19 = pMVar14->num_values;
    (pMVar14->vertex_to_encoded_attribute_value_index_map).
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[uVar11] =
         iVar19;
    pMVar14->num_values = iVar19 + 1;
    p_Var10 = (this->
              super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
              ).is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  }
  if ((p_Var10[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
    p_Var10[uVar16 >> 6] = p_Var10[uVar16 >> 6] | 1L << ((byte)uVar16 & 0x3f);
    if (local_44.value_ == 0xffffffff) {
      uVar17 = 0xffffffff;
    }
    else if (local_44.value_ * -0x55555555 < 0x55555556) {
      uVar17 = local_44.value_ + 2;
    }
    else {
      uVar17 = local_44.value_ - 1;
    }
    local_48.value_ = uVar17;
    PointsSequencer::AddPointId
              ((this->
               super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
               ).traversal_observer_.sequencer_,
               (PointIndex)
               (((this->
                 super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                 ).traversal_observer_.mesh_)->faces_).vector_.
               super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(ulong)uVar17 / 3]._M_elems[uVar17 % 3].
               value_);
    pMVar14 = (this->
              super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
              ).traversal_observer_.encoding_data_;
    iVar4._M_current =
         (pMVar14->encoded_attribute_value_index_to_corner_map).
         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (pMVar14->encoded_attribute_value_index_to_corner_map).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
      ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                  *)pMVar14,iVar4,&local_48);
      pMVar14 = (this->
                super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                ).traversal_observer_.encoding_data_;
    }
    else {
      (iVar4._M_current)->value_ = uVar17;
      (pMVar14->encoded_attribute_value_index_to_corner_map).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    iVar19 = pMVar14->num_values;
    (pMVar14->vertex_to_encoded_attribute_value_index_map).
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[uVar16] =
         iVar19;
    pMVar14->num_values = iVar19 + 1;
  }
  IVar9.value_ = local_44.value_;
  if (local_44.value_ == 0xffffffff) {
    uVar11 = 0xffffffff;
  }
  else {
    uVar11 = (ulong)(((this->
                      super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                      ).corner_table_)->corner_to_vertex_map_).vector_.
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_44.value_].value_;
  }
  p_Var10 = (this->
            super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
            ).is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar16 = p_Var10[uVar11 >> 6];
  if ((uVar16 >> (uVar11 & 0x3f) & 1) == 0) {
    p_Var10[uVar11 >> 6] = 1L << ((byte)uVar11 & 0x3f) | uVar16;
    local_48.value_ = local_44.value_;
    PointsSequencer::AddPointId
              ((this->
               super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
               ).traversal_observer_.sequencer_,
               (PointIndex)
               (((this->
                 super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                 ).traversal_observer_.mesh_)->faces_).vector_.
               super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(ulong)local_44.value_ / 3]._M_elems
               [local_44.value_ % 3].value_);
    pMVar14 = (this->
              super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
              ).traversal_observer_.encoding_data_;
    iVar4._M_current =
         (pMVar14->encoded_attribute_value_index_to_corner_map).
         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (pMVar14->encoded_attribute_value_index_to_corner_map).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
      ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                  *)pMVar14,iVar4,&local_48);
      pMVar14 = (this->
                super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                ).traversal_observer_.encoding_data_;
    }
    else {
      (iVar4._M_current)->value_ = IVar9.value_;
      (pMVar14->encoded_attribute_value_index_to_corner_map).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    iVar19 = pMVar14->num_values;
    (pMVar14->vertex_to_encoded_attribute_value_index_map).
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[uVar11] =
         iVar19;
    pMVar14->num_values = iVar19 + 1;
  }
  uVar11 = (ulong)(uint)this->best_priority_;
  if (2 < this->best_priority_) {
    return true;
  }
  local_40 = &this->traversal_stacks_[0].
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
LAB_0012aed7:
  ppIVar12 = local_40 + (long)(int)uVar11 * 3;
  lVar13 = 0;
  while (pIVar6 = *ppIVar12, ((_Vector_impl_data *)(ppIVar12 + -1))->_M_start == pIVar6) {
    lVar13 = lVar13 + -1;
    ppIVar12 = ppIVar12 + 3;
    if ((long)(int)uVar11 + -3 == lVar13) {
      return true;
    }
  }
  uVar11 = (uVar11 & 0xffffffff) - lVar13;
  uVar17 = pIVar6[-1].value_;
  *ppIVar12 = pIVar6 + -1;
  this->best_priority_ = (int)uVar11;
  if (uVar17 == 0xffffffff) {
    return true;
  }
  p_Var10 = (this->
            super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
            ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  if ((*(ulong *)((long)p_Var10 + (ulong)(uVar17 / 0x18 & 0xfffffff8)) >> ((ulong)uVar17 / 3 & 0x3f)
      & 1) == 0) {
LAB_0012af4c:
    uVar11 = (ulong)uVar17 / 3;
    puVar1 = (ulong *)((long)p_Var10 + (ulong)(uVar17 / 0x18 & 0xfffffff8));
    *puVar1 = *puVar1 | 1L << ((byte)uVar11 & 0x3f);
    if (uVar17 == 0xffffffff) {
      uVar16 = 0xffffffff;
    }
    else {
      uVar16 = (ulong)(((this->
                        super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                        ).corner_table_)->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar17].value_;
    }
    p_Var10 = (this->
              super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
              ).is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar7 = p_Var10[uVar16 >> 6];
    local_44.value_ = uVar17;
    if ((uVar7 >> (uVar16 & 0x3f) & 1) == 0) {
      p_Var10[uVar16 >> 6] = 1L << ((byte)uVar16 & 0x3f) | uVar7;
      local_48.value_ = uVar17;
      PointsSequencer::AddPointId
                ((this->
                 super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                 ).traversal_observer_.sequencer_,
                 (PointIndex)
                 (((this->
                   super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                   ).traversal_observer_.mesh_)->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_elems[uVar17 % 3].value_);
      pMVar14 = (this->
                super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                ).traversal_observer_.encoding_data_;
      iVar4._M_current =
           (pMVar14->encoded_attribute_value_index_to_corner_map).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (pMVar14->encoded_attribute_value_index_to_corner_map).
          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
        ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                  ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                    *)pMVar14,iVar4,&local_48);
        pMVar14 = (this->
                  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                  ).traversal_observer_.encoding_data_;
      }
      else {
        (iVar4._M_current)->value_ = uVar17;
        (pMVar14->encoded_attribute_value_index_to_corner_map).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      iVar19 = pMVar14->num_values;
      (pMVar14->vertex_to_encoded_attribute_value_index_map).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[uVar16]
           = iVar19;
      pMVar14->num_values = iVar19 + 1;
    }
    if (local_44.value_ == 0xffffffff) goto LAB_0012b20a;
    pCVar5 = (this->
             super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
             ).corner_table_;
    uVar17 = local_44.value_ - 2;
    if (0x55555555 < (local_44.value_ + 1) * -0x55555555) {
      uVar17 = local_44.value_ + 1;
    }
    if (uVar17 == 0xffffffff) {
      uVar15 = 0xffffffff;
    }
    else {
      uVar15 = (pCVar5->opposite_corners_).vector_.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar17].value_;
    }
    if (local_44.value_ * -0x55555555 < 0x55555556) {
      uVar17 = local_44.value_ + 2;
      if (uVar17 != 0xffffffff) goto LAB_0012b07f;
      uVar17 = 0xffffffff;
    }
    else {
      uVar17 = local_44.value_ - 1;
LAB_0012b07f:
      uVar17 = (pCVar5->opposite_corners_).vector_.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar17].value_;
    }
    if (uVar15 == 0xffffffff) {
      bVar20 = true;
      if (uVar17 != 0xffffffff) goto LAB_0012b0d7;
      goto LAB_0012b20a;
    }
    uVar11 = 1L << ((byte)((ulong)uVar15 / 3) & 0x3f) &
             *(ulong *)((long)(this->
                              super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                              ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                       (ulong)(uVar15 / 0x18 & 0xfffffff8));
    bVar20 = uVar11 != 0;
    if (uVar17 != 0xffffffff) {
LAB_0012b0d7:
      uVar11 = (ulong)uVar17;
      p_Var10 = (this->
                super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      if ((p_Var10[uVar11 / 0xc0] >> (uVar11 / 3 & 0x3f) & 1) == 0) goto LAB_0012b115;
      goto LAB_0012b0f9;
    }
    if (uVar11 != 0) goto LAB_0012b20a;
    goto LAB_0012b108;
  }
  goto LAB_0012b215;
LAB_0012b115:
  IVar3.value_ = (pCVar5->corner_to_vertex_map_).vector_.
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11].value_;
  uVar11 = (ulong)IVar3.value_;
  uVar18 = 0;
  if (((this->
       super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
       ).is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[IVar3.value_ >> 6] >>
       (uVar11 & 0x3f) & 1) == 0) {
    piVar8 = (this->prediction_degree_).vector_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar19 = piVar8[uVar11];
    piVar8[uVar11] = iVar19 + 1;
    uVar18 = (iVar19 < 1) + 1;
  }
  if ((bool)(bVar20 & (int)uVar18 <= this->best_priority_)) goto LAB_0012af4c;
  pvVar2 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
            *)(local_38 + uVar18);
  iVar4._M_current = *(IndexType<unsigned_int,_draco::CornerIndex_tag_type_> **)(pvVar2 + 8);
  if (iVar4._M_current == *(IndexType<unsigned_int,_draco::CornerIndex_tag_type_> **)(pvVar2 + 0x10)
     ) {
    local_48.value_ = uVar17;
    std::
    vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
    ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
              (pvVar2,iVar4,&local_48);
  }
  else {
    (iVar4._M_current)->value_ = uVar17;
    *(IndexType<unsigned_int,_draco::CornerIndex_tag_type_> **)(pvVar2 + 8) = iVar4._M_current + 1;
  }
  if ((int)uVar18 < this->best_priority_) {
    this->best_priority_ = uVar18;
  }
LAB_0012b0f9:
  if (bVar20) {
LAB_0012b20a:
    uVar11 = (ulong)(uint)this->best_priority_;
    goto LAB_0012b215;
  }
  if (uVar15 == 0xffffffff) {
    uVar11 = 0xffffffff;
  }
  else {
LAB_0012b108:
    uVar11 = (ulong)(((this->
                      super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                      ).corner_table_)->corner_to_vertex_map_).vector_.
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar15].value_;
  }
  uVar16 = 0;
  if (((this->
       super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
       ).is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar11 >> 6] >>
       (uVar11 & 0x3f) & 1) == 0) {
    piVar8 = (this->prediction_degree_).vector_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar19 = piVar8[uVar11];
    piVar8[uVar11] = iVar19 + 1;
    uVar16 = (ulong)((iVar19 < 1) + 1);
  }
  iVar19 = (int)uVar16;
  if (iVar19 <= this->best_priority_) {
    p_Var10 = (this->
              super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
              ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar17 = uVar15;
    goto LAB_0012af4c;
  }
  pvVar2 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
            *)(local_38 + uVar16);
  iVar4._M_current = *(IndexType<unsigned_int,_draco::CornerIndex_tag_type_> **)(pvVar2 + 8);
  if (iVar4._M_current == *(IndexType<unsigned_int,_draco::CornerIndex_tag_type_> **)(pvVar2 + 0x10)
     ) {
    local_48.value_ = uVar15;
    std::
    vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
    ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
              (pvVar2,iVar4,&local_48);
  }
  else {
    (iVar4._M_current)->value_ = uVar15;
    *(IndexType<unsigned_int,_draco::CornerIndex_tag_type_> **)(pvVar2 + 8) = iVar4._M_current + 1;
  }
  uVar11 = (ulong)(uint)this->best_priority_;
  if (iVar19 < this->best_priority_) {
    this->best_priority_ = iVar19;
    uVar11 = uVar16;
  }
LAB_0012b215:
  if (2 < (int)uVar11) {
    return true;
  }
  goto LAB_0012aed7;
}

Assistant:

bool TraverseFromCorner(CornerIndex corner_id) {
    if (prediction_degree_.size() == 0) {
      return true;
    }

    // Traversal starts from the |corner_id|. It's going to follow either the
    // right or the left neighboring faces to |corner_id| based on their
    // prediction degree.
    traversal_stacks_[0].push_back(corner_id);
    best_priority_ = 0;
    // For the first face, check the remaining corners as they may not be
    // processed yet.
    const VertexIndex next_vert =
        this->corner_table()->Vertex(this->corner_table()->Next(corner_id));
    const VertexIndex prev_vert =
        this->corner_table()->Vertex(this->corner_table()->Previous(corner_id));
    if (!this->IsVertexVisited(next_vert)) {
      this->MarkVertexVisited(next_vert);
      this->traversal_observer().OnNewVertexVisited(
          next_vert, this->corner_table()->Next(corner_id));
    }
    if (!this->IsVertexVisited(prev_vert)) {
      this->MarkVertexVisited(prev_vert);
      this->traversal_observer().OnNewVertexVisited(
          prev_vert, this->corner_table()->Previous(corner_id));
    }
    const VertexIndex tip_vertex = this->corner_table()->Vertex(corner_id);
    if (!this->IsVertexVisited(tip_vertex)) {
      this->MarkVertexVisited(tip_vertex);
      this->traversal_observer().OnNewVertexVisited(tip_vertex, corner_id);
    }
    // Start the actual traversal.
    while ((corner_id = PopNextCornerToTraverse()) != kInvalidCornerIndex) {
      FaceIndex face_id(corner_id.value() / 3);
      // Make sure the face hasn't been visited yet.
      if (this->IsFaceVisited(face_id)) {
        // This face has been already traversed.
        continue;
      }

      while (true) {
        face_id = FaceIndex(corner_id.value() / 3);
        this->MarkFaceVisited(face_id);
        this->traversal_observer().OnNewFaceVisited(face_id);

        // If the newly reached vertex hasn't been visited, mark it and notify
        // the observer.
        const VertexIndex vert_id = this->corner_table()->Vertex(corner_id);
        if (!this->IsVertexVisited(vert_id)) {
          this->MarkVertexVisited(vert_id);
          this->traversal_observer().OnNewVertexVisited(vert_id, corner_id);
        }

        // Check whether we can traverse to the right and left neighboring
        // faces.
        const CornerIndex right_corner_id =
            this->corner_table()->GetRightCorner(corner_id);
        const CornerIndex left_corner_id =
            this->corner_table()->GetLeftCorner(corner_id);
        const FaceIndex right_face_id(
            (right_corner_id == kInvalidCornerIndex
                 ? kInvalidFaceIndex
                 : FaceIndex(right_corner_id.value() / 3)));
        const FaceIndex left_face_id(
            (left_corner_id == kInvalidCornerIndex
                 ? kInvalidFaceIndex
                 : FaceIndex(left_corner_id.value() / 3)));
        const bool is_right_face_visited = this->IsFaceVisited(right_face_id);
        const bool is_left_face_visited = this->IsFaceVisited(left_face_id);

        if (!is_left_face_visited) {
          // We can go to the left face.
          const int priority = ComputePriority(left_corner_id);
          if (is_right_face_visited && priority <= best_priority_) {
            // Right face has been already visited and the priority is equal or
            // better than the best priority. We are sure that the left face
            // would be traversed next so there is no need to put it onto the
            // stack.
            corner_id = left_corner_id;
            continue;
          } else {
            AddCornerToTraversalStack(left_corner_id, priority);
          }
        }
        if (!is_right_face_visited) {
          // Go to the right face.
          const int priority = ComputePriority(right_corner_id);
          if (priority <= best_priority_) {
            // We are sure that the right face would be traversed next so there
            // is no need to put it onto the stack.
            corner_id = right_corner_id;
            continue;
          } else {
            AddCornerToTraversalStack(right_corner_id, priority);
          }
        }

        // Couldn't proceed directly to the next corner
        break;
      }
    }
    return true;
  }